

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_Gamemode(FParser *this)

{
  (this->t_return).type = 1;
  if (multiplayer == false) {
    (this->t_return).value.i = 0;
    return;
  }
  if (deathmatch.Value != 0) {
    (this->t_return).value.i = 2;
    return;
  }
  (this->t_return).value.i = 1;
  return;
}

Assistant:

void FParser::SF_Gamemode(void)
{
	t_return.type = svt_int;   
	if(!multiplayer)
	{
		t_return.value.i = 0; // single-player
	}
	else if(!deathmatch)
	{
		t_return.value.i = 1; // cooperative
	}
	else
		t_return.value.i = 2; // deathmatch
}